

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined4 uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  int iVar93;
  uint uVar95;
  long lVar96;
  Scene *pSVar97;
  long lVar98;
  undefined1 (*pauVar99) [16];
  ulong uVar100;
  long lVar101;
  undefined1 (*pauVar102) [16];
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  undefined1 (*pauVar106) [16];
  undefined1 (*pauVar107) [16];
  undefined4 uVar108;
  ulong unaff_R12;
  ulong uVar109;
  ulong uVar110;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  float fVar115;
  undefined1 auVar116 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar118 [32];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar139 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar149;
  undefined1 auVar150 [32];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [64];
  uint uVar158;
  undefined1 auVar159 [32];
  uint uVar161;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  undefined1 auVar160 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar171;
  undefined1 auVar172 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar173 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_27ac;
  RTCFilterFunctionNArguments local_27a8;
  ulong local_2778;
  float local_2770;
  float local_276c;
  float local_2768;
  float local_2764;
  float local_2760;
  undefined4 local_275c;
  uint local_2758;
  uint local_2754;
  uint local_2750;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  int iVar94;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      pauVar106 = (undefined1 (*) [16])local_2390;
      auVar116 = vmaxss_avx(ZEXT816(0) << 0x40,
                            ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar129 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar137._8_4_ = 0x7fffffff;
      auVar137._0_8_ = 0x7fffffff7fffffff;
      auVar137._12_4_ = 0x7fffffff;
      auVar137 = vandps_avx((undefined1  [16])aVar2,auVar137);
      auVar142._8_4_ = 0x219392ef;
      auVar142._0_8_ = 0x219392ef219392ef;
      auVar142._12_4_ = 0x219392ef;
      auVar137 = vcmpps_avx(auVar137,auVar142,1);
      auVar137 = vblendvps_avx((undefined1  [16])aVar2,auVar142,auVar137);
      auVar142 = vrcpps_avx(auVar137);
      fVar115 = auVar142._0_4_;
      auVar132._0_4_ = auVar137._0_4_ * fVar115;
      fVar124 = auVar142._4_4_;
      auVar132._4_4_ = auVar137._4_4_ * fVar124;
      fVar125 = auVar142._8_4_;
      auVar132._8_4_ = auVar137._8_4_ * fVar125;
      fVar126 = auVar142._12_4_;
      auVar132._12_4_ = auVar137._12_4_ * fVar126;
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = &DAT_3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar137 = vsubps_avx(auVar143,auVar132);
      uVar108 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23e0._4_4_ = uVar108;
      local_23e0._0_4_ = uVar108;
      local_23e0._8_4_ = uVar108;
      local_23e0._12_4_ = uVar108;
      local_23e0._16_4_ = uVar108;
      local_23e0._20_4_ = uVar108;
      local_23e0._24_4_ = uVar108;
      local_23e0._28_4_ = uVar108;
      auVar146 = ZEXT3264(local_23e0);
      uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2400._4_4_ = uVar108;
      local_2400._0_4_ = uVar108;
      local_2400._8_4_ = uVar108;
      local_2400._12_4_ = uVar108;
      local_2400._16_4_ = uVar108;
      local_2400._20_4_ = uVar108;
      local_2400._24_4_ = uVar108;
      local_2400._28_4_ = uVar108;
      auVar148 = ZEXT3264(local_2400);
      auVar133._0_4_ = fVar115 + fVar115 * auVar137._0_4_;
      auVar133._4_4_ = fVar124 + fVar124 * auVar137._4_4_;
      auVar133._8_4_ = fVar125 + fVar125 * auVar137._8_4_;
      auVar133._12_4_ = fVar126 + fVar126 * auVar137._12_4_;
      uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2420._4_4_ = uVar108;
      local_2420._0_4_ = uVar108;
      local_2420._8_4_ = uVar108;
      local_2420._12_4_ = uVar108;
      local_2420._16_4_ = uVar108;
      local_2420._20_4_ = uVar108;
      local_2420._24_4_ = uVar108;
      local_2420._28_4_ = uVar108;
      auVar151 = ZEXT3264(local_2420);
      auVar137 = vshufps_avx(auVar133,auVar133,0);
      local_2440._16_16_ = auVar137;
      local_2440._0_16_ = auVar137;
      auVar160 = ZEXT3264(local_2440);
      auVar137 = vmovshdup_avx(auVar133);
      auVar142 = vshufps_avx(auVar133,auVar133,0x55);
      local_2460._16_16_ = auVar142;
      local_2460._0_16_ = auVar142;
      auVar168 = ZEXT3264(local_2460);
      auVar142 = vshufpd_avx(auVar133,auVar133,1);
      auVar132 = vshufps_avx(auVar133,auVar133,0xaa);
      uVar100 = (ulong)(auVar133._0_4_ < 0.0) * 0x20;
      uVar104 = (ulong)(auVar137._0_4_ < 0.0) << 5 | 0x40;
      local_2480._16_16_ = auVar132;
      local_2480._0_16_ = auVar132;
      auVar170 = ZEXT3264(local_2480);
      uVar105 = (ulong)(auVar142._0_4_ < 0.0) << 5 | 0x80;
      auVar137 = vshufps_avx(auVar116,auVar116,0);
      local_24a0._16_16_ = auVar137;
      local_24a0._0_16_ = auVar137;
      auVar173 = ZEXT3264(local_24a0);
      auVar137 = vshufps_avx(auVar129,auVar129,0);
      local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
      auVar114 = ZEXT3264(CONCAT1616(auVar137,auVar137));
      local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
      auVar118._8_4_ = 0xbf800000;
      auVar118._0_8_ = 0xbf800000bf800000;
      auVar118._12_4_ = 0xbf800000;
      auVar118._16_4_ = 0xbf800000;
      auVar118._20_4_ = 0xbf800000;
      auVar118._24_4_ = 0xbf800000;
      auVar118._28_4_ = 0xbf800000;
      auVar135._8_4_ = 0x3f800000;
      auVar135._0_8_ = &DAT_3f8000003f800000;
      auVar135._12_4_ = 0x3f800000;
      auVar135._16_4_ = 0x3f800000;
      auVar135._20_4_ = 0x3f800000;
      auVar135._24_4_ = 0x3f800000;
      auVar135._28_4_ = 0x3f800000;
      _local_24e0 = vblendvps_avx(auVar135,auVar118,local_24c0);
      do {
        do {
          do {
            if (pauVar106 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar107 = pauVar106 + -1;
            pauVar106 = pauVar106 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar107 + 8));
          uVar110 = *(ulong *)*pauVar106;
          do {
            auVar111 = auVar151._0_32_;
            auVar135 = auVar148._0_32_;
            auVar118 = auVar146._0_32_;
            if ((uVar110 & 8) == 0) {
              auVar119 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar100),auVar118);
              auVar70._4_4_ = auVar160._4_4_ * auVar119._4_4_;
              auVar70._0_4_ = auVar160._0_4_ * auVar119._0_4_;
              auVar70._8_4_ = auVar160._8_4_ * auVar119._8_4_;
              auVar70._12_4_ = auVar160._12_4_ * auVar119._12_4_;
              auVar70._16_4_ = auVar160._16_4_ * auVar119._16_4_;
              auVar70._20_4_ = auVar160._20_4_ * auVar119._20_4_;
              auVar70._24_4_ = auVar160._24_4_ * auVar119._24_4_;
              auVar70._28_4_ = auVar119._28_4_;
              auVar119 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar104),auVar135);
              auVar71._4_4_ = auVar168._4_4_ * auVar119._4_4_;
              auVar71._0_4_ = auVar168._0_4_ * auVar119._0_4_;
              auVar71._8_4_ = auVar168._8_4_ * auVar119._8_4_;
              auVar71._12_4_ = auVar168._12_4_ * auVar119._12_4_;
              auVar71._16_4_ = auVar168._16_4_ * auVar119._16_4_;
              auVar71._20_4_ = auVar168._20_4_ * auVar119._20_4_;
              auVar71._24_4_ = auVar168._24_4_ * auVar119._24_4_;
              auVar71._28_4_ = auVar119._28_4_;
              auVar119 = vmaxps_avx(auVar70,auVar71);
              auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + uVar105),auVar111);
              auVar72._4_4_ = auVar170._4_4_ * auVar70._4_4_;
              auVar72._0_4_ = auVar170._0_4_ * auVar70._0_4_;
              auVar72._8_4_ = auVar170._8_4_ * auVar70._8_4_;
              auVar72._12_4_ = auVar170._12_4_ * auVar70._12_4_;
              auVar72._16_4_ = auVar170._16_4_ * auVar70._16_4_;
              auVar72._20_4_ = auVar170._20_4_ * auVar70._20_4_;
              auVar72._24_4_ = auVar170._24_4_ * auVar70._24_4_;
              auVar72._28_4_ = auVar70._28_4_;
              auVar70 = vmaxps_avx(auVar72,auVar173._0_32_);
              local_2660 = vmaxps_avx(auVar119,auVar70);
              auVar119 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + (uVar100 ^ 0x20)),
                                    auVar118);
              auVar73._4_4_ = auVar160._4_4_ * auVar119._4_4_;
              auVar73._0_4_ = auVar160._0_4_ * auVar119._0_4_;
              auVar73._8_4_ = auVar160._8_4_ * auVar119._8_4_;
              auVar73._12_4_ = auVar160._12_4_ * auVar119._12_4_;
              auVar73._16_4_ = auVar160._16_4_ * auVar119._16_4_;
              auVar73._20_4_ = auVar160._20_4_ * auVar119._20_4_;
              auVar73._24_4_ = auVar160._24_4_ * auVar119._24_4_;
              auVar73._28_4_ = auVar119._28_4_;
              auVar119 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + (uVar104 ^ 0x20)),
                                    auVar135);
              auVar74._4_4_ = auVar168._4_4_ * auVar119._4_4_;
              auVar74._0_4_ = auVar168._0_4_ * auVar119._0_4_;
              auVar74._8_4_ = auVar168._8_4_ * auVar119._8_4_;
              auVar74._12_4_ = auVar168._12_4_ * auVar119._12_4_;
              auVar74._16_4_ = auVar168._16_4_ * auVar119._16_4_;
              auVar74._20_4_ = auVar168._20_4_ * auVar119._20_4_;
              auVar74._24_4_ = auVar168._24_4_ * auVar119._24_4_;
              auVar74._28_4_ = auVar119._28_4_;
              auVar119 = vminps_avx(auVar73,auVar74);
              auVar70 = vsubps_avx(*(undefined1 (*) [32])(uVar110 + 0x40 + (uVar105 ^ 0x20)),
                                   auVar111);
              auVar75._4_4_ = auVar170._4_4_ * auVar70._4_4_;
              auVar75._0_4_ = auVar170._0_4_ * auVar70._0_4_;
              auVar75._8_4_ = auVar170._8_4_ * auVar70._8_4_;
              auVar75._12_4_ = auVar170._12_4_ * auVar70._12_4_;
              auVar75._16_4_ = auVar170._16_4_ * auVar70._16_4_;
              auVar75._20_4_ = auVar170._20_4_ * auVar70._20_4_;
              auVar75._24_4_ = auVar170._24_4_ * auVar70._24_4_;
              auVar75._28_4_ = auVar70._28_4_;
              auVar70 = vminps_avx(auVar75,auVar114._0_32_);
              auVar119 = vminps_avx(auVar119,auVar70);
              auVar119 = vcmpps_avx(local_2660,auVar119,2);
              uVar108 = vmovmskps_avx(auVar119);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar108);
            }
            if ((uVar110 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar93 = 4;
              }
              else {
                uVar109 = uVar110 & 0xfffffffffffffff0;
                lVar98 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                  }
                }
                iVar93 = 0;
                iVar94 = 0;
                uVar110 = *(ulong *)(uVar109 + lVar98 * 8);
                uVar103 = unaff_R12 - 1 & unaff_R12;
                if (uVar103 != 0) {
                  uVar158 = *(uint *)(local_2660 + lVar98 * 4);
                  lVar98 = 0;
                  if (uVar103 != 0) {
                    for (; (uVar103 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                    }
                  }
                  uVar3 = *(ulong *)(uVar109 + lVar98 * 8);
                  uVar95 = *(uint *)(local_2660 + lVar98 * 4);
                  uVar103 = uVar103 - 1 & uVar103;
                  iVar93 = iVar94;
                  if (uVar103 == 0) {
                    if (uVar158 < uVar95) {
                      *(ulong *)*pauVar106 = uVar3;
                      *(uint *)(*pauVar106 + 8) = uVar95;
                      pauVar106 = pauVar106 + 1;
                    }
                    else {
                      *(ulong *)*pauVar106 = uVar110;
                      *(uint *)(*pauVar106 + 8) = uVar158;
                      pauVar106 = pauVar106 + 1;
                      uVar110 = uVar3;
                    }
                  }
                  else {
                    auVar116._8_8_ = 0;
                    auVar116._0_8_ = uVar110;
                    auVar137 = vpunpcklqdq_avx(auVar116,ZEXT416(uVar158));
                    auVar129._8_8_ = 0;
                    auVar129._0_8_ = uVar3;
                    auVar116 = vpunpcklqdq_avx(auVar129,ZEXT416(uVar95));
                    lVar98 = 0;
                    if (uVar103 != 0) {
                      for (; (uVar103 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                      }
                    }
                    auVar134._8_8_ = 0;
                    auVar134._0_8_ = *(ulong *)(uVar109 + lVar98 * 8);
                    auVar129 = vpunpcklqdq_avx(auVar134,ZEXT416(*(uint *)(local_2660 + lVar98 * 4)))
                    ;
                    uVar103 = uVar103 - 1 & uVar103;
                    if (uVar103 == 0) {
                      auVar142 = vpcmpgtd_avx(auVar116,auVar137);
                      auVar132 = vpshufd_avx(auVar142,0xaa);
                      auVar142 = vblendvps_avx(auVar116,auVar137,auVar132);
                      auVar137 = vblendvps_avx(auVar137,auVar116,auVar132);
                      auVar116 = vpcmpgtd_avx(auVar129,auVar142);
                      auVar132 = vpshufd_avx(auVar116,0xaa);
                      auVar116 = vblendvps_avx(auVar129,auVar142,auVar132);
                      auVar129 = vblendvps_avx(auVar142,auVar129,auVar132);
                      auVar142 = vpcmpgtd_avx(auVar129,auVar137);
                      auVar132 = vpshufd_avx(auVar142,0xaa);
                      auVar142 = vblendvps_avx(auVar129,auVar137,auVar132);
                      auVar137 = vblendvps_avx(auVar137,auVar129,auVar132);
                      *pauVar106 = auVar137;
                      pauVar106[1] = auVar142;
                      pauVar106 = pauVar106 + 2;
                      uVar110 = auVar116._0_8_;
                    }
                    else {
                      lVar98 = 0;
                      if (uVar103 != 0) {
                        for (; (uVar103 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                        }
                      }
                      auVar138._8_8_ = 0;
                      auVar138._0_8_ = *(ulong *)(uVar109 + lVar98 * 8);
                      auVar142 = vpunpcklqdq_avx(auVar138,ZEXT416(*(uint *)(local_2660 + lVar98 * 4)
                                                                 ));
                      uVar103 = uVar103 - 1 & uVar103;
                      if (uVar103 == 0) {
                        auVar132 = vpcmpgtd_avx(auVar116,auVar137);
                        auVar133 = vpshufd_avx(auVar132,0xaa);
                        auVar132 = vblendvps_avx(auVar116,auVar137,auVar133);
                        auVar137 = vblendvps_avx(auVar137,auVar116,auVar133);
                        auVar116 = vpcmpgtd_avx(auVar142,auVar129);
                        auVar133 = vpshufd_avx(auVar116,0xaa);
                        auVar116 = vblendvps_avx(auVar142,auVar129,auVar133);
                        auVar129 = vblendvps_avx(auVar129,auVar142,auVar133);
                        auVar142 = vpcmpgtd_avx(auVar129,auVar137);
                        auVar133 = vpshufd_avx(auVar142,0xaa);
                        auVar142 = vblendvps_avx(auVar129,auVar137,auVar133);
                        auVar137 = vblendvps_avx(auVar137,auVar129,auVar133);
                        auVar129 = vpcmpgtd_avx(auVar116,auVar132);
                        auVar133 = vpshufd_avx(auVar129,0xaa);
                        auVar129 = vblendvps_avx(auVar116,auVar132,auVar133);
                        auVar116 = vblendvps_avx(auVar132,auVar116,auVar133);
                        auVar132 = vpcmpgtd_avx(auVar142,auVar116);
                        auVar133 = vpshufd_avx(auVar132,0xaa);
                        auVar132 = vblendvps_avx(auVar142,auVar116,auVar133);
                        auVar116 = vblendvps_avx(auVar116,auVar142,auVar133);
                        *pauVar106 = auVar137;
                        pauVar106[1] = auVar116;
                        pauVar106[2] = auVar132;
                        uVar110 = auVar129._0_8_;
                        pauVar107 = pauVar106 + 3;
                      }
                      else {
                        *pauVar106 = auVar137;
                        pauVar106[1] = auVar116;
                        pauVar106[2] = auVar129;
                        pauVar106[3] = auVar142;
                        lVar98 = 0x30;
                        do {
                          lVar101 = lVar98;
                          lVar98 = 0;
                          if (uVar103 != 0) {
                            for (; (uVar103 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                            }
                          }
                          auVar117._8_8_ = 0;
                          auVar117._0_8_ = *(ulong *)(uVar109 + lVar98 * 8);
                          auVar137 = vpunpcklqdq_avx(auVar117,ZEXT416(*(uint *)(local_2660 +
                                                                               lVar98 * 4)));
                          *(undefined1 (*) [16])(pauVar106[1] + lVar101) = auVar137;
                          uVar103 = uVar103 & uVar103 - 1;
                          lVar98 = lVar101 + 0x10;
                        } while (uVar103 != 0);
                        pauVar107 = (undefined1 (*) [16])(pauVar106[1] + lVar101);
                        if (lVar101 + 0x10 != 0) {
                          lVar98 = 0x10;
                          pauVar99 = pauVar106;
                          do {
                            auVar137 = pauVar99[1];
                            uVar158 = *(uint *)(pauVar99[1] + 8);
                            pauVar99 = pauVar99 + 1;
                            lVar101 = lVar98;
                            do {
                              if (uVar158 <= *(uint *)(pauVar106[-1] + lVar101 + 8)) {
                                pauVar102 = (undefined1 (*) [16])(*pauVar106 + lVar101);
                                break;
                              }
                              *(undefined1 (*) [16])(*pauVar106 + lVar101) =
                                   *(undefined1 (*) [16])(pauVar106[-1] + lVar101);
                              lVar101 = lVar101 + -0x10;
                              pauVar102 = pauVar106;
                            } while (lVar101 != 0);
                            *pauVar102 = auVar137;
                            lVar98 = lVar98 + 0x10;
                          } while (pauVar107 != pauVar99);
                        }
                        uVar110 = *(ulong *)*pauVar107;
                      }
                      auVar146 = ZEXT3264(auVar118);
                      auVar148 = ZEXT3264(auVar135);
                      auVar151 = ZEXT3264(auVar111);
                      auVar160 = ZEXT3264(auVar160._0_32_);
                      auVar168 = ZEXT3264(auVar168._0_32_);
                      auVar170 = ZEXT3264(auVar170._0_32_);
                      auVar173 = ZEXT3264(auVar173._0_32_);
                      pauVar106 = pauVar107;
                    }
                  }
                }
              }
            }
            else {
              iVar93 = 6;
            }
          } while (iVar93 == 0);
        } while (iVar93 != 6);
        uVar109 = (ulong)((uint)uVar110 & 0xf);
        if (uVar109 != 8) {
          uVar110 = uVar110 & 0xfffffffffffffff0;
          lVar98 = 0;
          do {
            lVar96 = lVar98 * 0xe0;
            lVar101 = uVar110 + 0xd0 + lVar96;
            local_2680 = *(undefined8 *)(lVar101 + 0x10);
            uStack_2678 = *(undefined8 *)(lVar101 + 0x18);
            lVar101 = uVar110 + 0xc0 + lVar96;
            local_23c0 = *(undefined8 *)(lVar101 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar101 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            uStack_2670 = local_2680;
            uStack_2668 = uStack_2678;
            auVar136._16_16_ = *(undefined1 (*) [16])(uVar110 + 0x60 + lVar96);
            auVar136._0_16_ = *(undefined1 (*) [16])(uVar110 + lVar96);
            auVar144._16_16_ = *(undefined1 (*) [16])(uVar110 + 0x70 + lVar96);
            auVar144._0_16_ = *(undefined1 (*) [16])(uVar110 + 0x10 + lVar96);
            auVar147._16_16_ = *(undefined1 (*) [16])(uVar110 + 0x80 + lVar96);
            auVar147._0_16_ = *(undefined1 (*) [16])(uVar110 + 0x20 + lVar96);
            auVar137 = *(undefined1 (*) [16])(uVar110 + 0x30 + lVar96);
            auVar111._16_16_ = auVar137;
            auVar111._0_16_ = auVar137;
            auVar116 = *(undefined1 (*) [16])(uVar110 + 0x40 + lVar96);
            auVar119._16_16_ = auVar116;
            auVar119._0_16_ = auVar116;
            auVar129 = *(undefined1 (*) [16])(uVar110 + 0x50 + lVar96);
            auVar130._16_16_ = auVar129;
            auVar130._0_16_ = auVar129;
            auVar142 = *(undefined1 (*) [16])(uVar110 + 0x90 + lVar96);
            auVar159._16_16_ = auVar142;
            auVar159._0_16_ = auVar142;
            auVar142 = *(undefined1 (*) [16])(uVar110 + 0xa0 + lVar96);
            auVar167._16_16_ = auVar142;
            auVar167._0_16_ = auVar142;
            auVar142 = *(undefined1 (*) [16])(uVar110 + 0xb0 + lVar96);
            auVar169._16_16_ = auVar142;
            auVar169._0_16_ = auVar142;
            local_2700 = vsubps_avx(auVar136,auVar111);
            local_26c0 = vsubps_avx(auVar144,auVar119);
            auVar118 = vsubps_avx(auVar147,auVar130);
            auVar135 = vsubps_avx(auVar159,auVar136);
            auVar111 = vsubps_avx(auVar167,auVar144);
            auVar119 = vsubps_avx(auVar169,auVar147);
            fVar126 = auVar119._0_4_;
            fVar171 = local_26c0._0_4_;
            fVar10 = auVar119._4_4_;
            fVar174 = local_26c0._4_4_;
            auVar76._4_4_ = fVar174 * fVar10;
            auVar76._0_4_ = fVar171 * fVar126;
            fVar20 = auVar119._8_4_;
            fVar175 = local_26c0._8_4_;
            auVar76._8_4_ = fVar175 * fVar20;
            fVar30 = auVar119._12_4_;
            fVar176 = local_26c0._12_4_;
            auVar76._12_4_ = fVar176 * fVar30;
            fVar40 = auVar119._16_4_;
            fVar177 = local_26c0._16_4_;
            auVar76._16_4_ = fVar177 * fVar40;
            fVar50 = auVar119._20_4_;
            fVar178 = local_26c0._20_4_;
            auVar76._20_4_ = fVar178 * fVar50;
            fVar60 = auVar119._24_4_;
            fVar179 = local_26c0._24_4_;
            auVar76._24_4_ = fVar179 * fVar60;
            auVar76._28_4_ = auVar137._12_4_;
            fVar127 = auVar111._0_4_;
            fVar149 = auVar118._0_4_;
            fVar11 = auVar111._4_4_;
            fVar152 = auVar118._4_4_;
            auVar78._4_4_ = fVar152 * fVar11;
            auVar78._0_4_ = fVar149 * fVar127;
            fVar21 = auVar111._8_4_;
            fVar153 = auVar118._8_4_;
            auVar78._8_4_ = fVar153 * fVar21;
            fVar31 = auVar111._12_4_;
            fVar154 = auVar118._12_4_;
            auVar78._12_4_ = fVar154 * fVar31;
            fVar41 = auVar111._16_4_;
            fVar155 = auVar118._16_4_;
            auVar78._16_4_ = fVar155 * fVar41;
            fVar51 = auVar111._20_4_;
            fVar156 = auVar118._20_4_;
            auVar78._20_4_ = fVar156 * fVar51;
            fVar61 = auVar111._24_4_;
            uVar77 = auVar116._12_4_;
            fVar157 = auVar118._24_4_;
            auVar78._24_4_ = fVar157 * fVar61;
            auVar78._28_4_ = uVar77;
            local_2720 = vsubps_avx(auVar78,auVar76);
            fVar128 = auVar135._0_4_;
            fVar12 = auVar135._4_4_;
            auVar79._4_4_ = fVar152 * fVar12;
            auVar79._0_4_ = fVar149 * fVar128;
            fVar22 = auVar135._8_4_;
            auVar79._8_4_ = fVar153 * fVar22;
            fVar32 = auVar135._12_4_;
            auVar79._12_4_ = fVar154 * fVar32;
            fVar42 = auVar135._16_4_;
            auVar79._16_4_ = fVar155 * fVar42;
            fVar52 = auVar135._20_4_;
            auVar79._20_4_ = fVar156 * fVar52;
            fVar62 = auVar135._24_4_;
            auVar79._24_4_ = fVar157 * fVar62;
            auVar79._28_4_ = uVar77;
            fVar140 = local_2700._0_4_;
            fVar13 = local_2700._4_4_;
            auVar81._4_4_ = fVar10 * fVar13;
            auVar81._0_4_ = fVar126 * fVar140;
            fVar23 = local_2700._8_4_;
            auVar81._8_4_ = fVar20 * fVar23;
            fVar33 = local_2700._12_4_;
            auVar81._12_4_ = fVar30 * fVar33;
            fVar43 = local_2700._16_4_;
            auVar81._16_4_ = fVar40 * fVar43;
            fVar53 = local_2700._20_4_;
            auVar81._20_4_ = fVar50 * fVar53;
            fVar63 = local_2700._24_4_;
            fVar80 = auVar129._12_4_;
            auVar81._24_4_ = fVar60 * fVar63;
            auVar81._28_4_ = fVar80;
            auVar118 = vsubps_avx(auVar81,auVar79);
            auVar82._4_4_ = fVar11 * fVar13;
            auVar82._0_4_ = fVar127 * fVar140;
            auVar82._8_4_ = fVar21 * fVar23;
            auVar82._12_4_ = fVar31 * fVar33;
            auVar82._16_4_ = fVar41 * fVar43;
            auVar82._20_4_ = fVar51 * fVar53;
            auVar82._24_4_ = fVar61 * fVar63;
            auVar82._28_4_ = fVar80;
            auVar83._4_4_ = fVar174 * fVar12;
            auVar83._0_4_ = fVar171 * fVar128;
            auVar83._8_4_ = fVar175 * fVar22;
            auVar83._12_4_ = fVar176 * fVar32;
            auVar83._16_4_ = fVar177 * fVar42;
            auVar83._20_4_ = fVar178 * fVar52;
            auVar83._24_4_ = fVar179 * fVar62;
            auVar83._28_4_ = local_26c0._28_4_;
            local_2740 = vsubps_avx(auVar83,auVar82);
            uVar108 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar172._4_4_ = uVar108;
            auVar172._0_4_ = uVar108;
            auVar172._8_4_ = uVar108;
            auVar172._12_4_ = uVar108;
            auVar172._16_4_ = uVar108;
            auVar172._20_4_ = uVar108;
            auVar172._24_4_ = uVar108;
            auVar172._28_4_ = uVar108;
            uVar108 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar180._4_4_ = uVar108;
            auVar180._0_4_ = uVar108;
            auVar180._8_4_ = uVar108;
            auVar180._12_4_ = uVar108;
            auVar180._16_4_ = uVar108;
            auVar180._20_4_ = uVar108;
            auVar180._24_4_ = uVar108;
            auVar180._28_4_ = uVar108;
            uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar181._4_4_ = uVar1;
            auVar181._0_4_ = uVar1;
            auVar181._8_4_ = uVar1;
            auVar181._12_4_ = uVar1;
            auVar181._16_4_ = uVar1;
            auVar181._20_4_ = uVar1;
            auVar181._24_4_ = uVar1;
            auVar181._28_4_ = uVar1;
            fVar115 = (ray->super_RayK<1>).dir.field_0.m128[1];
            auVar70 = vsubps_avx(auVar136,auVar172);
            fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar71 = vsubps_avx(auVar144,auVar180);
            auVar72 = vsubps_avx(auVar147,auVar181);
            fVar141 = auVar72._0_4_;
            fVar14 = auVar72._4_4_;
            auVar84._4_4_ = fVar115 * fVar14;
            auVar84._0_4_ = fVar115 * fVar141;
            fVar24 = auVar72._8_4_;
            auVar84._8_4_ = fVar115 * fVar24;
            fVar34 = auVar72._12_4_;
            auVar84._12_4_ = fVar115 * fVar34;
            fVar44 = auVar72._16_4_;
            auVar84._16_4_ = fVar115 * fVar44;
            fVar54 = auVar72._20_4_;
            auVar84._20_4_ = fVar115 * fVar54;
            fVar64 = auVar72._24_4_;
            auVar84._24_4_ = fVar115 * fVar64;
            auVar84._28_4_ = uVar108;
            fVar123 = auVar71._0_4_;
            fVar15 = auVar71._4_4_;
            auVar85._4_4_ = fVar124 * fVar15;
            auVar85._0_4_ = fVar124 * fVar123;
            fVar25 = auVar71._8_4_;
            auVar85._8_4_ = fVar124 * fVar25;
            fVar35 = auVar71._12_4_;
            auVar85._12_4_ = fVar124 * fVar35;
            fVar45 = auVar71._16_4_;
            auVar85._16_4_ = fVar124 * fVar45;
            fVar55 = auVar71._20_4_;
            auVar85._20_4_ = fVar124 * fVar55;
            fVar65 = auVar71._24_4_;
            auVar85._24_4_ = fVar124 * fVar65;
            auVar85._28_4_ = uVar1;
            auVar71 = vsubps_avx(auVar85,auVar84);
            fVar125 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar6 = auVar70._0_4_;
            fVar16 = auVar70._4_4_;
            auVar86._4_4_ = fVar124 * fVar16;
            auVar86._0_4_ = fVar124 * fVar6;
            fVar26 = auVar70._8_4_;
            auVar86._8_4_ = fVar124 * fVar26;
            fVar36 = auVar70._12_4_;
            auVar86._12_4_ = fVar124 * fVar36;
            fVar46 = auVar70._16_4_;
            auVar86._16_4_ = fVar124 * fVar46;
            fVar56 = auVar70._20_4_;
            auVar86._20_4_ = fVar124 * fVar56;
            fVar66 = auVar70._24_4_;
            auVar86._24_4_ = fVar124 * fVar66;
            auVar86._28_4_ = local_2720._28_4_;
            auVar87._4_4_ = fVar125 * fVar14;
            auVar87._0_4_ = fVar125 * fVar141;
            auVar87._8_4_ = fVar125 * fVar24;
            auVar87._12_4_ = fVar125 * fVar34;
            auVar87._16_4_ = fVar125 * fVar44;
            auVar87._20_4_ = fVar125 * fVar54;
            auVar87._24_4_ = fVar125 * fVar64;
            auVar87._28_4_ = uVar77;
            auVar70 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = fVar125 * fVar15;
            auVar88._0_4_ = fVar125 * fVar123;
            auVar88._8_4_ = fVar125 * fVar25;
            auVar88._12_4_ = fVar125 * fVar35;
            auVar88._16_4_ = fVar125 * fVar45;
            auVar88._20_4_ = fVar125 * fVar55;
            auVar88._24_4_ = fVar125 * fVar65;
            auVar88._28_4_ = uVar77;
            auVar89._4_4_ = fVar115 * fVar16;
            auVar89._0_4_ = fVar115 * fVar6;
            auVar89._8_4_ = fVar115 * fVar26;
            auVar89._12_4_ = fVar115 * fVar36;
            auVar89._16_4_ = fVar115 * fVar46;
            auVar89._20_4_ = fVar115 * fVar56;
            auVar89._24_4_ = fVar115 * fVar66;
            auVar89._28_4_ = fVar80;
            auVar72 = vsubps_avx(auVar89,auVar88);
            fVar7 = local_2740._0_4_;
            fVar17 = local_2740._4_4_;
            fVar27 = local_2740._8_4_;
            fVar37 = local_2740._12_4_;
            fVar47 = local_2740._16_4_;
            fVar57 = local_2740._20_4_;
            fVar67 = local_2740._24_4_;
            fVar8 = auVar118._0_4_;
            fVar18 = auVar118._4_4_;
            fVar28 = auVar118._8_4_;
            fVar38 = auVar118._12_4_;
            fVar48 = auVar118._16_4_;
            fVar58 = auVar118._20_4_;
            fVar68 = auVar118._24_4_;
            fVar9 = local_2720._0_4_;
            fVar19 = local_2720._4_4_;
            fVar29 = local_2720._8_4_;
            fVar39 = local_2720._12_4_;
            fVar49 = local_2720._16_4_;
            fVar59 = local_2720._20_4_;
            fVar69 = local_2720._24_4_;
            auVar131._0_4_ = fVar125 * fVar9 + fVar115 * fVar8 + fVar124 * fVar7;
            auVar131._4_4_ = fVar125 * fVar19 + fVar115 * fVar18 + fVar124 * fVar17;
            auVar131._8_4_ = fVar125 * fVar29 + fVar115 * fVar28 + fVar124 * fVar27;
            auVar131._12_4_ = fVar125 * fVar39 + fVar115 * fVar38 + fVar124 * fVar37;
            auVar131._16_4_ = fVar125 * fVar49 + fVar115 * fVar48 + fVar124 * fVar47;
            auVar131._20_4_ = fVar125 * fVar59 + fVar115 * fVar58 + fVar124 * fVar57;
            auVar131._24_4_ = fVar125 * fVar69 + fVar115 * fVar68 + fVar124 * fVar67;
            auVar131._28_4_ = fVar124 + fVar124 + fVar80;
            auVar120._8_4_ = 0x80000000;
            auVar120._0_8_ = 0x8000000080000000;
            auVar120._12_4_ = 0x80000000;
            auVar120._16_4_ = 0x80000000;
            auVar120._20_4_ = 0x80000000;
            auVar120._24_4_ = 0x80000000;
            auVar120._28_4_ = 0x80000000;
            auVar118 = vandps_avx(auVar131,auVar120);
            uVar158 = auVar118._0_4_;
            auVar145._0_4_ =
                 (float)(uVar158 ^
                        (uint)(fVar128 * auVar71._0_4_ +
                              fVar127 * auVar70._0_4_ + fVar126 * auVar72._0_4_));
            uVar95 = auVar118._4_4_;
            auVar145._4_4_ =
                 (float)(uVar95 ^ (uint)(fVar12 * auVar71._4_4_ +
                                        fVar11 * auVar70._4_4_ + fVar10 * auVar72._4_4_));
            uVar161 = auVar118._8_4_;
            auVar145._8_4_ =
                 (float)(uVar161 ^
                        (uint)(fVar22 * auVar71._8_4_ +
                              fVar21 * auVar70._8_4_ + fVar20 * auVar72._8_4_));
            uVar162 = auVar118._12_4_;
            auVar145._12_4_ =
                 (float)(uVar162 ^
                        (uint)(fVar32 * auVar71._12_4_ +
                              fVar31 * auVar70._12_4_ + fVar30 * auVar72._12_4_));
            uVar163 = auVar118._16_4_;
            auVar145._16_4_ =
                 (float)(uVar163 ^
                        (uint)(fVar42 * auVar71._16_4_ +
                              fVar41 * auVar70._16_4_ + fVar40 * auVar72._16_4_));
            uVar164 = auVar118._20_4_;
            auVar145._20_4_ =
                 (float)(uVar164 ^
                        (uint)(fVar52 * auVar71._20_4_ +
                              fVar51 * auVar70._20_4_ + fVar50 * auVar72._20_4_));
            uVar165 = auVar118._24_4_;
            auVar145._24_4_ =
                 (float)(uVar165 ^
                        (uint)(fVar62 * auVar71._24_4_ +
                              fVar61 * auVar70._24_4_ + fVar60 * auVar72._24_4_));
            uVar166 = auVar118._28_4_;
            auVar145._28_4_ =
                 (float)(uVar166 ^ (uint)(auVar135._28_4_ + auVar111._28_4_ + auVar119._28_4_));
            auVar150._0_4_ =
                 (float)(uVar158 ^
                        (uint)(auVar71._0_4_ * fVar140 +
                              auVar70._0_4_ * fVar171 + fVar149 * auVar72._0_4_));
            auVar150._4_4_ =
                 (float)(uVar95 ^ (uint)(auVar71._4_4_ * fVar13 +
                                        auVar70._4_4_ * fVar174 + fVar152 * auVar72._4_4_));
            auVar150._8_4_ =
                 (float)(uVar161 ^
                        (uint)(auVar71._8_4_ * fVar23 +
                              auVar70._8_4_ * fVar175 + fVar153 * auVar72._8_4_));
            auVar150._12_4_ =
                 (float)(uVar162 ^
                        (uint)(auVar71._12_4_ * fVar33 +
                              auVar70._12_4_ * fVar176 + fVar154 * auVar72._12_4_));
            auVar150._16_4_ =
                 (float)(uVar163 ^
                        (uint)(auVar71._16_4_ * fVar43 +
                              auVar70._16_4_ * fVar177 + fVar155 * auVar72._16_4_));
            auVar150._20_4_ =
                 (float)(uVar164 ^
                        (uint)(auVar71._20_4_ * fVar53 +
                              auVar70._20_4_ * fVar178 + fVar156 * auVar72._20_4_));
            auVar150._24_4_ =
                 (float)(uVar165 ^
                        (uint)(auVar71._24_4_ * fVar63 +
                              auVar70._24_4_ * fVar179 + fVar157 * auVar72._24_4_));
            auVar150._28_4_ = (float)(uVar166 ^ (uint)(auVar70._28_4_ + auVar72._28_4_ + -0.0));
            auVar135 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar118 = vcmpps_avx(auVar145,auVar135,5);
            auVar135 = vcmpps_avx(auVar150,auVar135,5);
            auVar118 = vandps_avx(auVar118,auVar135);
            auVar121._8_4_ = 0x7fffffff;
            auVar121._0_8_ = 0x7fffffff7fffffff;
            auVar121._12_4_ = 0x7fffffff;
            auVar121._16_4_ = 0x7fffffff;
            auVar121._20_4_ = 0x7fffffff;
            auVar121._24_4_ = 0x7fffffff;
            auVar121._28_4_ = 0x7fffffff;
            local_2600 = vandps_avx(auVar131,auVar121);
            auVar135 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar131,4);
            auVar118 = vandps_avx(auVar118,auVar135);
            auVar122._0_4_ = auVar150._0_4_ + auVar145._0_4_;
            auVar122._4_4_ = auVar150._4_4_ + auVar145._4_4_;
            auVar122._8_4_ = auVar150._8_4_ + auVar145._8_4_;
            auVar122._12_4_ = auVar150._12_4_ + auVar145._12_4_;
            auVar122._16_4_ = auVar150._16_4_ + auVar145._16_4_;
            auVar122._20_4_ = auVar150._20_4_ + auVar145._20_4_;
            auVar122._24_4_ = auVar150._24_4_ + auVar145._24_4_;
            auVar122._28_4_ = auVar150._28_4_ + auVar145._28_4_;
            auVar111 = vcmpps_avx(auVar122,local_2600,2);
            auVar135 = vandps_avx(auVar118,auVar111);
            auVar119 = local_26a0 & auVar135;
            if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar119 >> 0x7f,0) != '\0') ||
                  (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0xbf,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar119[0x1f] < '\0') {
              auVar135 = vandps_avx(auVar135,local_26a0);
              local_2620._0_4_ =
                   (float)(uVar158 ^ (uint)(fVar9 * fVar6 + fVar8 * fVar123 + fVar141 * fVar7));
              local_2620._4_4_ =
                   (float)(uVar95 ^ (uint)(fVar19 * fVar16 + fVar18 * fVar15 + fVar14 * fVar17));
              local_2620._8_4_ =
                   (float)(uVar161 ^ (uint)(fVar29 * fVar26 + fVar28 * fVar25 + fVar24 * fVar27));
              local_2620._12_4_ =
                   (float)(uVar162 ^ (uint)(fVar39 * fVar36 + fVar38 * fVar35 + fVar34 * fVar37));
              local_2620._16_4_ =
                   (float)(uVar163 ^ (uint)(fVar49 * fVar46 + fVar48 * fVar45 + fVar44 * fVar47));
              local_2620._20_4_ =
                   (float)(uVar164 ^ (uint)(fVar59 * fVar56 + fVar58 * fVar55 + fVar54 * fVar57));
              local_2620._24_4_ =
                   (float)(uVar165 ^ (uint)(fVar69 * fVar66 + fVar68 * fVar65 + fVar64 * fVar67));
              local_2620._28_4_ =
                   uVar166 ^ (uint)(auVar111._28_4_ + auVar111._28_4_ + auVar118._28_4_);
              fVar115 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar124 = local_2600._0_4_;
              fVar125 = local_2600._4_4_;
              auVar90._4_4_ = fVar125 * fVar115;
              auVar90._0_4_ = fVar124 * fVar115;
              fVar126 = local_2600._8_4_;
              auVar90._8_4_ = fVar126 * fVar115;
              fVar127 = local_2600._12_4_;
              auVar90._12_4_ = fVar127 * fVar115;
              fVar128 = local_2600._16_4_;
              auVar90._16_4_ = fVar128 * fVar115;
              fVar140 = local_2600._20_4_;
              auVar90._20_4_ = fVar140 * fVar115;
              fVar141 = local_2600._24_4_;
              auVar90._24_4_ = fVar141 * fVar115;
              auVar90._28_4_ = fVar115;
              auVar118 = vcmpps_avx(auVar90,local_2620,1);
              fVar115 = (ray->super_RayK<1>).tfar;
              auVar91._4_4_ = fVar125 * fVar115;
              auVar91._0_4_ = fVar124 * fVar115;
              auVar91._8_4_ = fVar126 * fVar115;
              auVar91._12_4_ = fVar127 * fVar115;
              auVar91._16_4_ = fVar128 * fVar115;
              auVar91._20_4_ = fVar140 * fVar115;
              auVar91._24_4_ = fVar141 * fVar115;
              auVar91._28_4_ = fVar115;
              auVar111 = vcmpps_avx(local_2620,auVar91,2);
              auVar118 = vandps_avx(auVar111,auVar118);
              auVar111 = auVar135 & auVar118;
              if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0x7f,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0xbf,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar111[0x1f] < '\0') {
                auVar118 = vandps_avx(auVar135,auVar118);
                local_25c0 = auVar118;
                auVar135 = vsubps_avx(local_2600,auVar150);
                local_2660 = vblendvps_avx(auVar145,auVar135,local_24c0);
                auVar135 = vsubps_avx(local_2600,auVar145);
                local_2640 = vblendvps_avx(auVar150,auVar135,local_24c0);
                local_2540[0] = fVar9 * (float)local_24e0._0_4_;
                local_2540[1] = fVar19 * (float)local_24e0._4_4_;
                local_2540[2] = fVar29 * fStack_24d8;
                local_2540[3] = fVar39 * fStack_24d4;
                fStack_2530 = fVar49 * fStack_24d0;
                fStack_252c = fVar59 * fStack_24cc;
                fStack_2528 = fVar69 * fStack_24c8;
                fStack_2524 = auVar150._28_4_;
                local_2520[0] = fVar8 * (float)local_24e0._0_4_;
                local_2520[1] = fVar18 * (float)local_24e0._4_4_;
                local_2520[2] = fVar28 * fStack_24d8;
                local_2520[3] = fVar38 * fStack_24d4;
                fStack_2510 = fVar48 * fStack_24d0;
                fStack_250c = fVar58 * fStack_24cc;
                fStack_2508 = fVar68 * fStack_24c8;
                fStack_2504 = auVar150._28_4_;
                auVar135 = vrcpps_avx(local_2600);
                local_2500[0] = (float)local_24e0._0_4_ * fVar7;
                local_2500[1] = (float)local_24e0._4_4_ * fVar17;
                local_2500[2] = fStack_24d8 * fVar27;
                local_2500[3] = fStack_24d4 * fVar37;
                fStack_24f0 = fStack_24d0 * fVar47;
                fStack_24ec = fStack_24cc * fVar57;
                fStack_24e8 = fStack_24c8 * fVar67;
                fStack_24e4 = auVar150._28_4_;
                fVar115 = auVar135._0_4_;
                fVar123 = auVar135._4_4_;
                auVar92._4_4_ = fVar125 * fVar123;
                auVar92._0_4_ = fVar124 * fVar115;
                fVar124 = auVar135._8_4_;
                auVar92._8_4_ = fVar126 * fVar124;
                fVar125 = auVar135._12_4_;
                auVar92._12_4_ = fVar127 * fVar125;
                fVar126 = auVar135._16_4_;
                auVar92._16_4_ = fVar128 * fVar126;
                fVar127 = auVar135._20_4_;
                auVar92._20_4_ = fVar140 * fVar127;
                fVar128 = auVar135._24_4_;
                auVar92._24_4_ = fVar141 * fVar128;
                auVar92._28_4_ = auVar150._28_4_;
                auVar139._8_4_ = 0x3f800000;
                auVar139._0_8_ = &DAT_3f8000003f800000;
                auVar139._12_4_ = 0x3f800000;
                auVar139._16_4_ = 0x3f800000;
                auVar139._20_4_ = 0x3f800000;
                auVar139._24_4_ = 0x3f800000;
                auVar139._28_4_ = 0x3f800000;
                auVar135 = vsubps_avx(auVar139,auVar92);
                fVar115 = fVar115 + fVar115 * auVar135._0_4_;
                fVar123 = fVar123 + fVar123 * auVar135._4_4_;
                fVar124 = fVar124 + fVar124 * auVar135._8_4_;
                fVar125 = fVar125 + fVar125 * auVar135._12_4_;
                fVar126 = fVar126 + fVar126 * auVar135._16_4_;
                fVar127 = fVar127 + fVar127 * auVar135._20_4_;
                fVar128 = fVar128 + fVar128 * auVar135._24_4_;
                local_2720._4_4_ = fVar123 * local_2620._4_4_;
                local_2720._0_4_ = fVar115 * local_2620._0_4_;
                local_2720._8_4_ = fVar124 * local_2620._8_4_;
                local_2720._12_4_ = fVar125 * local_2620._12_4_;
                local_2720._16_4_ = fVar126 * local_2620._16_4_;
                local_2720._20_4_ = fVar127 * local_2620._20_4_;
                local_2720._24_4_ = fVar128 * local_2620._24_4_;
                local_2720._28_4_ = 0x3f800000;
                local_26e0 = auVar118;
                local_2560 = local_2720;
                local_25a0[0] = local_2660._0_4_ * fVar115;
                local_25a0[1] = local_2660._4_4_ * fVar123;
                local_25a0[2] = local_2660._8_4_ * fVar124;
                local_25a0[3] = local_2660._12_4_ * fVar125;
                fStack_2590 = local_2660._16_4_ * fVar126;
                fStack_258c = local_2660._20_4_ * fVar127;
                fStack_2588 = local_2660._24_4_ * fVar128;
                uStack_2584 = local_2660._28_4_;
                local_2580[0] = local_2640._0_4_ * fVar115;
                local_2580[1] = local_2640._4_4_ * fVar123;
                local_2580[2] = local_2640._8_4_ * fVar124;
                local_2580[3] = local_2640._12_4_ * fVar125;
                fStack_2570 = local_2640._16_4_ * fVar126;
                fStack_256c = local_2640._20_4_ * fVar127;
                fStack_2568 = local_2640._24_4_ * fVar128;
                uStack_2564 = local_2640._28_4_;
                auVar112._8_4_ = 0x7f800000;
                auVar112._0_8_ = 0x7f8000007f800000;
                auVar112._12_4_ = 0x7f800000;
                auVar112._16_4_ = 0x7f800000;
                auVar112._20_4_ = 0x7f800000;
                auVar112._24_4_ = 0x7f800000;
                auVar112._28_4_ = 0x7f800000;
                auVar135 = vblendvps_avx(auVar112,local_2720,auVar118);
                auVar111 = vshufps_avx(auVar135,auVar135,0xb1);
                auVar111 = vminps_avx(auVar135,auVar111);
                auVar119 = vshufpd_avx(auVar111,auVar111,5);
                auVar111 = vminps_avx(auVar111,auVar119);
                auVar119 = vperm2f128_avx(auVar111,auVar111,1);
                auVar111 = vminps_avx(auVar111,auVar119);
                auVar135 = vcmpps_avx(auVar135,auVar111,0);
                auVar111 = auVar118 & auVar135;
                if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar111 >> 0x7f,0) != '\0') ||
                      (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0xbf,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar111[0x1f] < '\0') {
                  auVar118 = vandps_avx(auVar135,auVar118);
                }
                uVar95 = vmovmskps_avx(auVar118);
                uVar158 = 0;
                if (uVar95 != 0) {
                  for (; (uVar95 >> uVar158 & 1) == 0; uVar158 = uVar158 + 1) {
                  }
                }
                local_26c0._0_8_ = context->scene;
                pSVar97 = context->scene;
                do {
                  uVar103 = (ulong)uVar158;
                  uVar158 = *(uint *)((long)&local_23c0 + uVar103 * 4);
                  pGVar4 = (pSVar97->geometries).items[uVar158].ptr;
                  local_2700._0_8_ = pGVar4;
                  if ((pGVar4->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_26e0 + uVar103 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar115 = local_25a0[uVar103];
                      fVar124 = local_2580[uVar103];
                      (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar103 * 4);
                      (ray->Ng).field_0.field_0.x = local_2540[uVar103];
                      (ray->Ng).field_0.field_0.y = local_2520[uVar103];
                      (ray->Ng).field_0.field_0.z = local_2500[uVar103];
                      ray->u = fVar115;
                      ray->v = fVar124;
                      ray->primID = *(uint *)((long)&local_2680 + uVar103 * 4);
                      ray->geomID = uVar158;
                      pRVar5 = context->user;
                      ray->instID[0] = pRVar5->instID[0];
                      ray->instPrimID[0] = pRVar5->instPrimID[0];
                      break;
                    }
                    local_2740._0_8_ = context->args;
                    local_27a8.context = context->user;
                    local_2770 = local_2540[uVar103];
                    local_276c = local_2520[uVar103];
                    local_2768 = local_2500[uVar103];
                    local_2764 = local_25a0[uVar103];
                    local_2760 = local_2580[uVar103];
                    local_275c = *(undefined4 *)((long)&local_2680 + uVar103 * 4);
                    local_2758 = uVar158;
                    local_2754 = (local_27a8.context)->instID[0];
                    local_2750 = (local_27a8.context)->instPrimID[0];
                    fVar115 = (ray->super_RayK<1>).tfar;
                    local_2778 = uVar103;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar103 * 4);
                    local_27ac = -1;
                    local_27a8.valid = &local_27ac;
                    local_27a8.geometryUserPtr = pGVar4->userPtr;
                    local_27a8.ray = (RTCRayN *)ray;
                    local_27a8.hit = (RTCHitN *)&local_2770;
                    local_27a8.N = 1;
                    if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->intersectionFilterN)(&local_27a8), *local_27a8.valid != 0)) {
                      if (*(code **)(local_2740._0_8_ + 0x10) != (code *)0x0) {
                        if (((*(byte *)local_2740._0_8_ & 2) != 0) ||
                           ((*(byte *)(local_2700._0_8_ + 0x3e) & 0x40) != 0)) {
                          (**(code **)(local_2740._0_8_ + 0x10))(&local_27a8);
                        }
                        if (*local_27a8.valid == 0) goto LAB_015b6691;
                      }
                      (((Vec3f *)((long)local_27a8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_27a8.hit;
                      (((Vec3f *)((long)local_27a8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_27a8.hit + 4);
                      (((Vec3f *)((long)local_27a8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_27a8.hit + 8);
                      *(float *)((long)local_27a8.ray + 0x3c) = *(float *)(local_27a8.hit + 0xc);
                      *(float *)((long)local_27a8.ray + 0x40) = *(float *)(local_27a8.hit + 0x10);
                      *(float *)((long)local_27a8.ray + 0x44) = *(float *)(local_27a8.hit + 0x14);
                      *(float *)((long)local_27a8.ray + 0x48) = *(float *)(local_27a8.hit + 0x18);
                      *(float *)((long)local_27a8.ray + 0x4c) = *(float *)(local_27a8.hit + 0x1c);
                      *(float *)((long)local_27a8.ray + 0x50) = *(float *)(local_27a8.hit + 0x20);
                    }
                    else {
LAB_015b6691:
                      (ray->super_RayK<1>).tfar = fVar115;
                    }
                    *(undefined4 *)(local_26e0 + local_2778 * 4) = 0;
                    fVar115 = (ray->super_RayK<1>).tfar;
                    auVar113._4_4_ = fVar115;
                    auVar113._0_4_ = fVar115;
                    auVar113._8_4_ = fVar115;
                    auVar113._12_4_ = fVar115;
                    auVar113._16_4_ = fVar115;
                    auVar113._20_4_ = fVar115;
                    auVar113._24_4_ = fVar115;
                    auVar113._28_4_ = fVar115;
                    auVar118 = vcmpps_avx(local_2720,auVar113,2);
                    local_26e0 = vandps_avx(auVar118,local_26e0);
                  }
                  if ((((((((local_26e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_26e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_26e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_26e0 >> 0x7f,0) == '\0') &&
                        (local_26e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_26e0 >> 0xbf,0) == '\0') &&
                      (local_26e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_26e0[0x1f]) break;
                  BVHNIntersector1<8,1,false,embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,true>>>
                  ::intersect(&local_27a8);
                  pSVar97 = (Scene *)local_26c0._0_8_;
                  uVar158 = (uint)local_27a8.valid;
                } while( true );
              }
            }
            lVar98 = lVar98 + 1;
          } while (lVar98 != uVar109 - 8);
        }
        fVar115 = (ray->super_RayK<1>).tfar;
        auVar114 = ZEXT3264(CONCAT428(fVar115,CONCAT424(fVar115,CONCAT420(fVar115,CONCAT416(fVar115,
                                                  CONCAT412(fVar115,CONCAT48(fVar115,CONCAT44(
                                                  fVar115,fVar115))))))));
        auVar146 = ZEXT3264(local_23e0);
        auVar148 = ZEXT3264(local_2400);
        auVar151 = ZEXT3264(local_2420);
        auVar160 = ZEXT3264(local_2440);
        auVar168 = ZEXT3264(local_2460);
        auVar170 = ZEXT3264(local_2480);
        auVar173 = ZEXT3264(local_24a0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }